

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

void output_token_noswap(Context_conflict2 *ctx,uint32 token)

{
  uint pos;
  uint32 local_28;
  uint local_24;
  char *local_20;
  ulong local_18;
  
  if (ctx->isfail == 0) {
    local_28 = token;
    buffer_append(ctx->output,&local_28,4);
    local_24 = 0;
    local_20 = preprocessor_sourcepos(ctx->preprocessor,&local_24);
    local_18 = (ulong)local_24;
    buffer_append(ctx->token_to_source,&local_20,0x10);
  }
  return;
}

Assistant:

static void output_token_noswap(Context *ctx, const uint32 token)
{
    if (!isfail(ctx))
    {
        buffer_append(ctx->output, &token, sizeof (token));

        // We only need a list of these that grows throughout processing, and
        //  is flattened for reference at the end of the run, so we use a
        //  Buffer. It's sneaky!
        unsigned int pos = 0;
        const char *fname = preprocessor_sourcepos(ctx->preprocessor, &pos);
        SourcePos srcpos;
        memset(&srcpos, '\0', sizeof (SourcePos));
        srcpos.line = pos;
        srcpos.filename = fname;  // cached in preprocessor!
        buffer_append(ctx->token_to_source, &srcpos, sizeof (SourcePos));
    } // if
}